

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

bool r_exec::dis(Context *context,uint16_t *index)

{
  bool bVar1;
  char cVar2;
  uint16_t uVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_00;
  long *plVar7;
  Atom *pAVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  undefined1 auVar14 [16];
  double dVar15;
  Atom local_50 [4];
  Atom local_4c [4];
  undefined8 local_48;
  long *plVar5;
  
  iVar4 = (*context->implementation->_vptr__Context[7])(context->implementation,1);
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x40))(plVar5);
  (**(code **)(*plVar5 + 8))(plVar5);
  iVar4 = (*context->implementation->_vptr__Context[7])(context->implementation,2);
  plVar5 = (long *)CONCAT44(extraout_var_00,iVar4);
  plVar7 = (long *)(**(code **)(*plVar5 + 0x40))(plVar5);
  (**(code **)(*plVar5 + 8))(plVar5);
  (**(code **)(*plVar6 + 0x20))(plVar6,0);
  cVar2 = r_code::Atom::isFloat();
  if (cVar2 == '\0') {
    (**(code **)(*plVar6 + 0x20))(plVar6,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x39) {
      (**(code **)(*plVar7 + 0x20))(plVar7,0);
      cVar2 = r_code::Atom::getDescriptor();
      if (cVar2 == -0x39) {
        pAVar8 = (Atom *)(**(code **)(*plVar6 + 0x20))(plVar6,0);
        lVar9 = r_code::Utils::GetTimestamp(pAVar8);
        pAVar8 = (Atom *)(**(code **)(*plVar7 + 0x20))(plVar7,0);
        lVar10 = r_code::Utils::GetTimestamp(pAVar8);
        lVar9 = lVar9 - lVar10;
        auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar14._0_8_ = lVar9;
        auVar14._12_4_ = 0x45300000;
        dVar15 = (auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
        uVar11 = (ulong)dVar15;
        uVar3 = Context::setTimestampResult
                          (context,(long)(dVar15 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f |
                                   uVar11);
        *index = uVar3;
        goto LAB_0019e24a;
      }
    }
LAB_0019e24f:
    r_code::Atom::Nil();
    uVar3 = Context::setAtomicResult(context,local_50);
    *index = uVar3;
    r_code::Atom::~Atom(local_50);
    bVar12 = false;
    bVar1 = false;
    if (plVar7 == (long *)0x0) goto LAB_0019e284;
  }
  else {
    (**(code **)(*plVar7 + 0x20))(plVar7,0);
    cVar2 = r_code::Atom::isFloat();
    if (cVar2 == '\0') goto LAB_0019e24f;
    (**(code **)(*plVar6 + 0x20))(plVar6,0);
    local_48 = r_code::Atom::asFloat();
    (**(code **)(*plVar7 + 0x20))(plVar7,0);
    fVar13 = (float)r_code::Atom::asFloat();
    r_code::Atom::Float(ABS((float)local_48 - fVar13));
    uVar3 = Context::setAtomicResult(context,local_4c);
    *index = uVar3;
    r_code::Atom::~Atom(local_4c);
LAB_0019e24a:
    bVar1 = true;
  }
  bVar12 = bVar1;
  (**(code **)(*plVar7 + 8))(plVar7);
LAB_0019e284:
  (**(code **)(*plVar6 + 8))(plVar6);
  return bVar12;
}

Assistant:

bool dis(const Context &context, uint16_t &index)
{
    Context lhs = *context.getChild(1);
    Context rhs = *context.getChild(2);

    if (lhs[0].isFloat()) {
        if (rhs[0].isFloat()) {
            index = context.setAtomicResult(Atom::Float(fabs(lhs[0].asFloat() - rhs[0].asFloat())));
            return true;
        }
    } else if (lhs[0].getDescriptor() == Atom::TIMESTAMP) {
        if (rhs[0].getDescriptor() == Atom::TIMESTAMP) {
            uint64_t lhs_t = Utils::GetTimestamp(&lhs[0]);
            uint64_t rhs_t = Utils::GetTimestamp(&rhs[0]);
            index = context.setTimestampResult(fabs((double)(lhs_t - rhs_t)));
            return true;
        }
    }

    index = context.setAtomicResult(Atom::Nil());
    return false;
}